

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O3

size_t __thiscall docopt::Option::hash(Option *this)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> hasher;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> hasher_1;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_22;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_21;
  
  sVar1 = LeafPattern::hash(&this->super_LeafPattern);
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(&local_22,&this->fShortOption);
  uVar3 = sVar2 + 0x9e3779b9 + (sVar1 >> 2) + sVar1 * 0x40 ^ sVar1;
  sVar1 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(&local_21,&this->fLongOption);
  uVar3 = sVar1 + uVar3 * 0x40 + (uVar3 >> 2) + 0x9e3779b9 ^ uVar3;
  return uVar3 ^ (uVar3 >> 2) + 0x9e3779b9 + uVar3 * 0x40 + (long)this->fArgcount;
}

Assistant:

virtual size_t hash() const override {
			size_t seed = LeafPattern::hash();
			hash_combine(seed, fShortOption);
			hash_combine(seed, fLongOption);
			hash_combine(seed, fArgcount);
			return seed;
		}